

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O3

void * __thiscall lan::db::get_var_data(db *this,db_bit_type type,string *data)

{
  int iVar1;
  string *__return_storage_ptr__;
  double dVar2;
  pointer pcVar3;
  string local_70;
  string local_50;
  string local_30;
  
  switch(type) {
  case Bool:
    __return_storage_ptr__ = (string *)operator_new(1);
    iVar1 = atoi((data->_M_dataplus)._M_p);
    *(bool *)&(__return_storage_ptr__->_M_dataplus)._M_p = iVar1 != 0;
    break;
  case Int:
    __return_storage_ptr__ = (string *)operator_new(4);
    iVar1 = atoi((data->_M_dataplus)._M_p);
    *(int *)&(__return_storage_ptr__->_M_dataplus)._M_p = iVar1;
    break;
  case Long:
    __return_storage_ptr__ = (string *)operator_new(8);
    pcVar3 = (pointer)atol((data->_M_dataplus)._M_p);
    goto LAB_0010bc2e;
  case LongLong:
    __return_storage_ptr__ = (string *)operator_new(8);
    pcVar3 = (pointer)atoll((data->_M_dataplus)._M_p);
LAB_0010bc2e:
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
    break;
  case Float:
    __return_storage_ptr__ = (string *)operator_new(4);
    dVar2 = atof((data->_M_dataplus)._M_p);
    *(float *)&(__return_storage_ptr__->_M_dataplus)._M_p = (float)dVar2;
    break;
  case Double:
    __return_storage_ptr__ = (string *)operator_new(8);
    pcVar3 = (pointer)strtod((data->_M_dataplus)._M_p,(char **)0x0);
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
    break;
  case Char:
    __return_storage_ptr__ = (string *)operator_new(1);
    std::__cxx11::string::substr((ulong)&local_50,(ulong)data);
    prepare_string_to_read(&local_30,(db *)data,&local_50);
    *(char *)&(__return_storage_ptr__->_M_dataplus)._M_p = *local_30._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_70.field_2._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
    local_70._M_dataplus._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_0010bd27;
  case String:
    __return_storage_ptr__ = (string *)operator_new(0x20);
    std::__cxx11::string::substr((ulong)&local_70,(ulong)data);
    prepare_string_to_read(__return_storage_ptr__,(db *)data,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return __return_storage_ptr__;
    }
LAB_0010bd27:
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    break;
  default:
    __return_storage_ptr__ = (string *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

void * db::get_var_data(db_bit_type type, std::string data){
            switch(type){
                case Bool: return new bool(atoi(data.data())); break;
                case Int:  return new int(atoi(data.data())); break;
                case Long: return new long(atol(data.data())); break;
                case LongLong: return new long long(atoll(data.data())); break;
                case Float: return new float(atof(data.data())); break;
                case Double: return new double(strtod(data.data(), nullptr));
                case Char: return new char(prepare_string_to_read(data.substr(1, data.length()-2))[0]);       break;
                case String: return new std::string(prepare_string_to_read(data.substr(1, data.length()-2))); break;
                default: return nullptr;
            }
        }